

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::elementAccessTest<true>(ViewTest *this)

{
  allocator<int> *paVar1;
  undefined1 *puVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  reference pvVar7;
  iterator iVar8;
  iterator iVar9;
  reference piVar10;
  bool local_671;
  int local_670;
  int local_66c;
  int w_3;
  int x_7;
  int y_7;
  int z_4;
  int i_5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_650;
  undefined1 local_648 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_11;
  undefined1 local_600 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_9;
  int local_5e0;
  int local_5dc;
  int w_2;
  int x_6;
  int y_6;
  int z_3;
  int i_4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_5c0;
  undefined1 local_5b8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_10;
  undefined1 local_570 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  int local_550;
  int x_5;
  int y_5;
  int z_2;
  int i_3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_538;
  undefined1 local_530 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_9;
  undefined1 local_4e8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  int local_4c8;
  int x_4;
  int y_4;
  int z_1;
  int i_2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_4b0;
  undefined1 local_4a8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_460 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  int local_440;
  int local_43c;
  int x_3;
  int y_3;
  int i_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_428;
  undefined1 local_420 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_7;
  undefined1 local_3d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  int local_3b8;
  int local_3b4;
  int x_2;
  int y_2;
  int i;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3a0;
  undefined1 local_398 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_350 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  ulong local_330;
  size_t j_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_320;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_318;
  undefined1 local_310 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_2c8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  ulong local_2a8;
  size_t j;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_298;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_290;
  undefined1 local_288 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_240 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  undefined1 local_220 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_1d8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_2;
  bool local_189;
  ulong local_188;
  size_t z;
  size_t y_1;
  size_t x_1;
  undefined1 local_168 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> w_1;
  undefined1 local_138 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  bool local_c9;
  ulong local_c8;
  size_t y;
  size_t x;
  undefined1 local_b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> w;
  undefined1 local_80 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  ViewTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,2,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar7 = 6;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1);
  *pvVar7 = 4;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  paVar1 = (allocator<int> *)
           ((long)&w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_80,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&w.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&x + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0,2,
             (allocator<unsigned_long> *)((long)&x + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&x + 7));
  for (y = 0; y < 6; y = y + 1) {
    for (local_c8 = 0; sVar6 = y, local_c8 < 4; local_c8 = local_c8 + 1) {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0,0);
      uVar4 = local_c8;
      *pvVar7 = sVar6;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0,1);
      *pvVar7 = uVar4;
      piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                          ((View<int,true,std::allocator<unsigned_long>> *)local_80,y,local_c8);
      iVar3 = *piVar10;
      shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
      piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                          ((View<int,true,std::allocator<unsigned_long>> *)local_80,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )shape_1.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      local_c9 = iVar3 == *piVar10;
      test(&local_c9);
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar2 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,2);
  *pvVar7 = 2;
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
  iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
  paVar1 = (allocator<int> *)
           ((long)&w_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_138,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar9._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&w_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&x_1 + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,3,
             (allocator<unsigned_long> *)((long)&x_1 + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&x_1 + 7));
  for (y_1 = 0; y_1 < 3; y_1 = y_1 + 1) {
    for (z = 0; z < 4; z = z + 1) {
      for (local_188 = 0; sVar6 = y_1, local_188 < 2; local_188 = local_188 + 1) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,0);
        sVar5 = z;
        *pvVar7 = sVar6;
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,1);
        uVar4 = local_188;
        *pvVar7 = sVar5;
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,2);
        *pvVar7 = uVar4;
        piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                            ((View<int,true,std::allocator<unsigned_long>> *)local_138,y_1,z,
                             local_188);
        iVar3 = *piVar10;
        v_2.geometry_._48_8_ =
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168);
        piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                            ((View<int,true,std::allocator<unsigned_long>> *)local_138,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )v_2.geometry_._48_8_);
        local_189 = iVar3 == *piVar10;
        test(&local_189);
      }
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_138);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
  puVar2 = &v_3.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1d8,&this->scalar_,
             (allocator_type *)puVar2);
  std::allocator<int>::~allocator((allocator<int> *)&v_3.geometry_.field_0x37);
  piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                      ((View<int,true,std::allocator<unsigned_long>> *)local_1d8,0);
  v_3.geometry_._54_1_ = *piVar10 == 0x2a;
  test((bool *)&v_3.geometry_.field_0x36);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1d8);
  paVar1 = (allocator<int> *)
           ((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_220,&this->scalar_,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                      ((View<int,true,std::allocator<unsigned_long>> *)local_220,0);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = *piVar10 == 0x2a;
  test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_220);
  puVar2 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_240,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_240,0);
  *pvVar7 = 0x18;
  local_290._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_240);
  local_298._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_240);
  std::allocator<int>::allocator((allocator<int> *)((long)&j + 7));
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_288,local_290,local_298,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j + 7));
  for (local_2a8 = 0; local_2a8 < 0x18; local_2a8 = local_2a8 + 1) {
    piVar10 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_288,local_2a8);
    shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar10 == this->data_[local_2a8];
    test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_288);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_240);
  puVar2 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c8,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c8,0);
  *pvVar7 = 0x18;
  local_318._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c8);
  local_320._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c8);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_1 + 7));
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_310,local_318,local_320,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_1 + 7));
  for (local_330 = 0; local_330 < 0x18; local_330 = local_330 + 1) {
    piVar10 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_310,local_330);
    shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar10 == this->data_[local_330];
    test((bool *)((long)&shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_310);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2c8);
  puVar2 = &v_6.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_350,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_6.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_350,0);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_350,1);
  *pvVar7 = 6;
  local_3a0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_350);
  _i = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_350);
  std::allocator<int>::allocator((allocator<int> *)((long)&y_2 + 3));
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_398,local_3a0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )_i,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&y_2 + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&y_2 + 3));
  x_2 = 0;
  for (local_3b4 = 0; local_3b4 < 6; local_3b4 = local_3b4 + 1) {
    for (local_3b8 = 0; local_3b8 < 4; local_3b8 = local_3b8 + 1) {
      piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                          ((View<int,true,std::allocator<unsigned_long>> *)local_398,(long)local_3b8
                           ,local_3b4);
      shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar10 == this->data_[x_2];
      test((bool *)((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      x_2 = x_2 + 1;
    }
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_398);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_350);
  puVar2 = &v_7.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_7.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8,0);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8,1);
  *pvVar7 = 6;
  local_428._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8);
  _i_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8);
  std::allocator<int>::allocator((allocator<int> *)((long)&y_3 + 3));
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_420,local_428,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )_i_1,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&y_3 + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&y_3 + 3));
  x_3 = 0;
  for (local_43c = 0; local_43c < 6; local_43c = local_43c + 1) {
    for (local_440 = 0; local_440 < 4; local_440 = local_440 + 1) {
      piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                          ((View<int,true,std::allocator<unsigned_long>> *)local_420,(long)local_440
                           ,local_43c);
      shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar10 == this->data_[x_3];
      test((bool *)((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      x_3 = x_3 + 1;
    }
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_420);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3d8);
  puVar2 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_460,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_460,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_460,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_460,2);
  *pvVar7 = 2;
  local_4b0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_460);
  _i_2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_460);
  std::allocator<int>::allocator((allocator<int> *)((long)&z_1 + 3));
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_4a8,local_4b0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )_i_2,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&z_1 + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&z_1 + 3));
  y_4 = 0;
  for (x_4 = 0; x_4 < 2; x_4 = x_4 + 1) {
    for (local_4c8 = 0; local_4c8 < 4; local_4c8 = local_4c8 + 1) {
      for (shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 3;
          shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                            ((View<int,true,std::allocator<unsigned_long>> *)local_4a8,
                             (long)shape_7.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_4c8,x_4);
        shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = *piVar10 == this->data_[y_4];
        test((bool *)((long)&shape_7.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
        y_4 = y_4 + 1;
      }
    }
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_4a8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_460);
  puVar2 = &v_9.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e8,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_9.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e8,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e8,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e8,2);
  *pvVar7 = 2;
  local_538._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e8);
  _i_3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e8);
  std::allocator<int>::allocator((allocator<int> *)((long)&z_2 + 3));
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_530,local_538,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )_i_3,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&z_2 + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&z_2 + 3));
  y_5 = 0;
  for (x_5 = 0; x_5 < 2; x_5 = x_5 + 1) {
    for (local_550 = 0; local_550 < 4; local_550 = local_550 + 1) {
      for (shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 3;
          shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                            ((View<int,true,std::allocator<unsigned_long>> *)local_530,
                             (long)shape_8.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_550,x_5);
        shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = *piVar10 == this->data_[y_5];
        test((bool *)((long)&shape_8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
        y_5 = y_5 + 1;
      }
    }
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_530);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4e8);
  puVar2 = &v_10.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_570,4,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_10.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_570,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_570,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_570,2);
  *pvVar7 = 2;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_570,3);
  *pvVar7 = 2;
  local_5c0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_570);
  _i_4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_570);
  std::allocator<int>::allocator((allocator<int> *)((long)&z_3 + 3));
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_5b8,local_5c0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )_i_4,this->data100_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&z_3 + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&z_3 + 3));
  y_6 = 0;
  for (x_6 = 0; x_6 < 2; x_6 = x_6 + 1) {
    for (w_2 = 0; w_2 < 2; w_2 = w_2 + 1) {
      for (local_5dc = 0; local_5dc < 4; local_5dc = local_5dc + 1) {
        for (local_5e0 = 0; local_5e0 < 3; local_5e0 = local_5e0 + 1) {
          piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                              ((View<int,true,std::allocator<unsigned_long>> *)local_5b8,
                               (long)local_5e0,local_5dc,w_2,x_6);
          shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar10 == this->data100_[y_6];
          test((bool *)((long)&shape_9.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          y_6 = y_6 + 1;
        }
      }
    }
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_5b8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_570);
  puVar2 = &v_11.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600,4,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_11.geometry_.field_0x37);
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600,0);
  *pvVar7 = 3;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600,1);
  *pvVar7 = 4;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600,2);
  *pvVar7 = 2;
  pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600,3);
  *pvVar7 = 2;
  local_650._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600);
  _i_5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600);
  std::allocator<int>::allocator((allocator<int> *)((long)&z_4 + 3));
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_648,local_650,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )_i_5,this->data100_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&z_4 + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&z_4 + 3));
  y_7 = 0;
  for (x_7 = 0; x_7 < 2; x_7 = x_7 + 1) {
    for (w_3 = 0; w_3 < 2; w_3 = w_3 + 1) {
      for (local_66c = 0; local_66c < 4; local_66c = local_66c + 1) {
        for (local_670 = 0; local_670 < 3; local_670 = local_670 + 1) {
          piVar10 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                              ((View<int,true,std::allocator<unsigned_long>> *)local_648,
                               (long)local_670,local_66c,w_3,x_7);
          local_671 = *piVar10 == this->data100_[y_7];
          test(&local_671);
          y_7 = y_7 + 1;
        }
      }
    }
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_648);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600);
  return;
}

Assistant:

void ViewTest::elementAccessTest(){
    // element access by coordinate
    {
        // 2D
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> w(2);
        
            for(std::size_t x=0; x<6; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    w[0] = x;
                    w[1] = y;
                    test(v(x, y) == v(w.begin()));
                }
            }
        }
        // 3D 
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> w(3);
        
            for(std::size_t x=0; x<3; ++x) {
                for(std::size_t y=0; y<4; ++y) {
                    for(std::size_t z=0; z<2; ++z) {
                        w[0] = x;
                        w[1] = y;
                        w[2] = z; 
                        test(v(x, y, z) == v(w.begin()));
                    }
                }
            }
        }
    }
    // scalar
    {
        {
            andres::View<int, constTarget> v(&scalar_);
            
            test(v(0) == 42);
        }
        // const
        {
            andres::View<int, constTarget> const v(&scalar_);
            
            test(v(0) == 42);
        }
    }
    // 1D 
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            for(std::size_t j=0; j<24; ++j) {
                test(v(j) == data_[j]); 
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            for(std::size_t j=0; j<24; ++j) {
                test(v(j) == data_[j]); 
            }
        }
    }
    // 2D
    {
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 4;
            shape[1] = 6;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int y = 0; y < 6; ++y){
                for(int x = 0; x < 4; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 4;
            shape[1] = 6;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int y = 0; y < 6; ++y){
                for(int x = 0; x < 4; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
    }
    // 3D 
    {
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 4; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
        // const
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 4; ++y){
                    for(int x = 0; x < 3; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
    }
    // 4D 
    {
        {
            std::vector<std::size_t> shape(4);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            shape[3] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data100_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 4; ++x){
                        for(int w = 0; w < 3; ++w){
                            test(v(w, x, y, z) == data100_[i]);
                            ++i;
                        }
                    }
                }
            }
        }
        // const 
        {
            std::vector<std::size_t> shape(4);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            shape[3] = 2;
            andres::View<int, constTarget> const v(shape.begin(), shape.end(), data100_);

            int i = 0;
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 2; ++y){
                    for(int x = 0; x < 4; ++x){
                        for(int w = 0; w < 3; ++w){
                            test(v(w, x, y, z) == data100_[i]);
                            ++i;
                        }
                    }
                }
            }
        }
    }
}